

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,ProcessorInstance *i)

{
  bool bVar1;
  Expression *pEVar2;
  pool_ptr<soul::AST::Expression> local_20;
  ProcessorInstance *local_18;
  ProcessorInstance *i_local;
  PostResolutionChecks *this_local;
  
  local_18 = i;
  i_local = (ProcessorInstance *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,i);
  local_20.object = (local_18->arraySize).object;
  checkArraySize(this,&local_20,0x100);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_20);
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&local_18->clockMultiplierRatio,(void *)0x0);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator*(&local_18->clockMultiplierRatio);
    validateClockRatio(pEVar2);
  }
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&local_18->clockDividerRatio,(void *)0x0);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator*(&local_18->clockDividerRatio);
    validateClockRatio(pEVar2);
  }
  return;
}

Assistant:

void visit (AST::ProcessorInstance& i) override
        {
            super::visit (i);
            checkArraySize (i.arraySize, AST::maxProcessorArraySize);

            if (i.clockMultiplierRatio != nullptr)   validateClockRatio (*i.clockMultiplierRatio);
            if (i.clockDividerRatio != nullptr)      validateClockRatio (*i.clockDividerRatio);
        }